

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O0

wchar_t lzh_decode_huffman(huffman_conflict *hf,uint rbits)

{
  uint in_ESI;
  huffman_conflict *in_RDI;
  wchar_t c;
  wchar_t local_4;
  
  local_4 = (wchar_t)in_RDI->tbl[in_ESI >> ((byte)in_RDI->shift_bits & 0x1f)];
  if (in_RDI->len_avail <= local_4) {
    local_4 = lzh_decode_huffman_tree(in_RDI,in_ESI,local_4);
  }
  return local_4;
}

Assistant:

static inline int
lzh_decode_huffman(struct huffman *hf, unsigned rbits)
{
	int c;
	/*
	 * At first search an index table for a bit pattern.
	 * If it fails, search a huffman tree for.
	 */
	c = hf->tbl[rbits >> hf->shift_bits];
	if (c < hf->len_avail)
		return (c);
	/* This bit pattern needs to be found out at a huffman tree. */
	return (lzh_decode_huffman_tree(hf, rbits, c));
}